

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void close_socket_gracefully(mg_connection *conn)

{
  int iVar1;
  linger lVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar7;
  socklen_t local_24;
  int local_20;
  socklen_t opt_len;
  int linger_timeout;
  int error_code;
  linger linger;
  mg_connection *conn_local;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  opt_len = 0;
  local_20 = -2;
  local_24 = 4;
  if (conn != (mg_connection *)0x0) {
    linger = (linger)conn;
    set_blocking_mode((conn->client).sock);
    shutdown(*(int *)((long)linger + 0x8f8),1);
    if (*(long *)(*(long *)((long)linger + 0x8e8) + 0x30) != 0) {
      local_20 = atoi(*(char **)(*(long *)((long)linger + 0x8e8) + 0x30));
    }
    if (local_20 < 0) {
      error_code = 0;
    }
    else {
      error_code = (local_20 + 999) / 1000;
    }
    linger_timeout = (int)(local_20 >= 0);
    if (-2 < local_20) {
      iVar3 = getsockopt(*(int *)((long)linger + 0x8f8),1,4,&opt_len,&local_24);
      lVar2 = linger;
      if (iVar3 == 0) {
        if ((opt_len != 0x68) &&
           (iVar4 = setsockopt(*(int *)((long)linger + 0x8f8),1,0xd,&linger_timeout,8),
           lVar2 = linger, iVar1 = error_code, iVar3 = linger_timeout, iVar4 != 0)) {
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          mg_cry_internal_wrap
                    ((mg_connection *)lVar2,(mg_context *)0x0,"close_socket_gracefully",0x45bc,
                     "%s: setsockopt(SOL_SOCKET SO_LINGER(%i,%i)) failed: %s",
                     "close_socket_gracefully",CONCAT44(uVar7,iVar3),iVar1,pcVar6);
        }
      }
      else {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        mg_cry_internal_wrap
                  ((mg_connection *)lVar2,(mg_context *)0x0,"close_socket_gracefully",0x45a5,
                   "%s: getsockopt(SOL_SOCKET SO_ERROR) failed: %s","close_socket_gracefully",pcVar6
                  );
      }
    }
    close(*(int *)((long)linger + 0x8f8));
    *(undefined4 *)((long)linger + 0x8f8) = 0xffffffff;
  }
  return;
}

Assistant:

static void
close_socket_gracefully(struct mg_connection *conn)
{
#if defined(_WIN32)
	char buf[MG_BUF_LEN];
	int n;
#endif
	struct linger linger;
	int error_code = 0;
	int linger_timeout = -2;
	socklen_t opt_len = sizeof(error_code);

	if (!conn) {
		return;
	}

	/* http://msdn.microsoft.com/en-us/library/ms739165(v=vs.85).aspx:
	 * "Note that enabling a nonzero timeout on a nonblocking socket
	 * is not recommended.", so set it to blocking now */
	set_blocking_mode(conn->client.sock);

	/* Send FIN to the client */
	shutdown(conn->client.sock, SHUTDOWN_WR);

#if defined(_WIN32)
	/* Read and discard pending incoming data. If we do not do that and
	 * close
	 * the socket, the data in the send buffer may be discarded. This
	 * behaviour is seen on Windows, when client keeps sending data
	 * when server decides to close the connection; then when client
	 * does recv() it gets no data back. */
	do {
		n = pull_inner(NULL, conn, buf, sizeof(buf), /* Timeout in s: */ 1.0);
	} while (n > 0);
#endif

	if (conn->dom_ctx->config[LINGER_TIMEOUT]) {
		linger_timeout = atoi(conn->dom_ctx->config[LINGER_TIMEOUT]);
	}

	/* Set linger option according to configuration */
	if (linger_timeout >= 0) {
		/* Set linger option to avoid socket hanging out after close. This
		 * prevent ephemeral port exhaust problem under high QPS. */
		linger.l_onoff = 1;

#if defined(_MSC_VER)
#pragma warning(push)
#pragma warning(disable : 4244)
#endif
#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wconversion"
#endif
		/* Data type of linger structure elements may differ,
		 * so we don't know what cast we need here.
		 * Disable type conversion warnings. */

		linger.l_linger = (linger_timeout + 999) / 1000;

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic pop
#endif
#if defined(_MSC_VER)
#pragma warning(pop)
#endif

	} else {
		linger.l_onoff = 0;
		linger.l_linger = 0;
	}

	if (linger_timeout < -1) {
		/* Default: don't configure any linger */
	} else if (getsockopt(conn->client.sock,
	                      SOL_SOCKET,
	                      SO_ERROR,
#if defined(_WIN32) /* WinSock uses different data type here */
	                      (char *)&error_code,
#else
	                      &error_code,
#endif
	                      &opt_len)
	           != 0) {
		/* Cannot determine if socket is already closed. This should
		 * not occur and never did in a test. Log an error message
		 * and continue. */
		mg_cry_internal(conn,
		                "%s: getsockopt(SOL_SOCKET SO_ERROR) failed: %s",
		                __func__,
		                strerror(ERRNO));
#if defined(_WIN32)
	} else if (error_code == WSAECONNRESET) {
#else
	} else if (error_code == ECONNRESET) {
#endif
		/* Socket already closed by client/peer, close socket without linger
		 */
	} else {

		/* Set linger timeout */
		if (setsockopt(conn->client.sock,
		               SOL_SOCKET,
		               SO_LINGER,
		               (char *)&linger,
		               sizeof(linger))
		    != 0) {
			mg_cry_internal(
			    conn,
			    "%s: setsockopt(SOL_SOCKET SO_LINGER(%i,%i)) failed: %s",
			    __func__,
			    linger.l_onoff,
			    linger.l_linger,
			    strerror(ERRNO));
		}
	}

	/* Now we know that our FIN is ACK-ed, safe to close */
	closesocket(conn->client.sock);
	conn->client.sock = INVALID_SOCKET;
}